

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceLocationIndex
          (PIQBase *this,GLuint program,GLenum programInterface,string *name,GLint expected,
          long *error)

{
  uint uVar1;
  
  uVar1 = glu::CallLogWrapper::glGetProgramResourceLocationIndex
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,(name->_M_dataplus)._M_p);
  if (uVar1 != expected) {
    anon_unknown_0::Output("ERROR: Got %d, expected %d\n",(ulong)uVar1,(ulong)(uint)expected);
    anon_unknown_0::Output
              ("CALL: glGetProgramResourceLocationIndex, with %d, %s\n",(ulong)programInterface,
               (name->_M_dataplus)._M_p);
    *error = -1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceLocationIndex(GLuint program, GLenum programInterface,
															  const std::string& name, GLint expected, long& error)
	{
		GLint res = glGetProgramResourceLocationIndex(program, programInterface, name.c_str());
		if (res != expected)
		{
			Output("ERROR: Got %d, expected %d\n", res, expected);
			Output("CALL: glGetProgramResourceLocationIndex, with %d, %s\n", programInterface, name.c_str());
			error = ERROR;
		}
	}